

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int c_itoa(char *buf,size_t buf_size,int64_t num,int base,int flags,int field_width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  char tmp [40];
  byte local_58 [48];
  
  pbVar8 = local_58;
  uVar5 = -num;
  if (0 < num) {
    uVar5 = num;
  }
  uVar6 = CONCAT44(0,base);
  uVar11 = 0;
  do {
    uVar10 = uVar11;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    bVar3 = SUB161(auVar2 % auVar1,0);
    bVar9 = bVar3 + 0x57;
    if (SUB168(auVar2 % auVar1,0) < 10) {
      bVar9 = bVar3 | 0x30;
    }
    local_58[uVar10] = bVar9;
    uVar11 = uVar10 + 1;
    bVar12 = uVar6 <= uVar5;
    uVar5 = uVar5 / uVar6;
  } while (bVar12);
  uVar4 = (uint)uVar11;
  if ((flags == 0) || (field_width <= (int)uVar4 || 0x25 < uVar10)) {
    uVar5 = uVar11 & 0xffffffff;
  }
  else {
    uVar5 = (ulong)(0x26 - uVar4);
    if ((ulong)(~uVar4 + field_width) < (ulong)(0x26 - uVar4)) {
      uVar5 = (ulong)(~uVar4 + field_width);
    }
    memset(local_58 + uVar10 + 1,0x30,uVar5 + 1);
    do {
      uVar5 = uVar11 + 1;
      if (field_width <= (int)uVar11 + 1) break;
      bVar12 = uVar11 < 0x26;
      uVar11 = uVar5;
    } while (bVar12);
  }
  uVar4 = (uint)uVar5;
  if (num < 0) {
    lVar7 = (long)(int)uVar4;
    uVar4 = uVar4 + 1;
    local_58[lVar7] = 0x2d;
  }
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      pbVar8 = pbVar8 + -1;
      if ((long)uVar5 < (long)(int)buf_size) {
        buf[uVar5] = pbVar8[uVar4];
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return (int)uVar5;
}

Assistant:

static int c_itoa(char *buf, size_t buf_size, int64_t num, int base, int flags,
                  int field_width) {
    char tmp[40];
    int i = 0, k = 0, neg = 0;

    if (num < 0) {
        neg++;
        num = -num;
    }

    /* Print into temporary buffer - in reverse order */
    do {
        int rem = num % base;
        if (rem < 10) {
            tmp[k++] = '0' + rem;
        } else {
            tmp[k++] = 'a' + (rem - 10);
        }
        num /= base;
    } while (num > 0);

    /* Zero padding */
    if (flags && C_SNPRINTF_FLAG_ZERO) {
        while (k < field_width && k < (int) sizeof(tmp) - 1) {
            tmp[k++] = '0';
        }
    }

    /* And sign */
    if (neg) {
        tmp[k++] = '-';
    }

    /* Now output */
    while (--k >= 0) {
        C_SNPRINTF_APPEND_CHAR(tmp[k]);
    }

    return i;
}